

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_TreatRepeatedFieldAsSetWithIgnoredFields_Test::
MessageDifferencerTest_TreatRepeatedFieldAsSetWithIgnoredFields_Test
          (MessageDifferencerTest_TreatRepeatedFieldAsSetWithIgnoredFields_Test *this)

{
  MessageDifferencerTest_TreatRepeatedFieldAsSetWithIgnoredFields_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__MessageDifferencerTest_TreatRepeatedFieldAsSetWithIgnoredFields_Test_02a245d8;
  return;
}

Assistant:

TEST(MessageDifferencerTest, TreatRepeatedFieldAsSetWithIgnoredFields) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  TextFormat::MergeFromString("rm { a: 11\n b: 12 }", &msg1);
  TextFormat::MergeFromString("rm { a: 11\n b: 13 }", &msg2);
  util::MessageDifferencer differ;
  differ.TreatAsSet(GetFieldDescriptor(msg1, "rm"));
  differ.AddIgnoreCriteria(std::make_unique<TestIgnorer>());
  EXPECT_TRUE(differ.Compare(msg1, msg2));
}